

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestCaseWrapper.cpp
# Opt level: O0

bool __thiscall deqp::TestCaseWrapper::deinitTestCase(TestCaseWrapper *this,TestCase *testCase)

{
  RenderContext *renderCtx;
  ContextInfo *ctxInfo;
  exception *e_1;
  Exception *e;
  TestLog *log;
  TestCase *testCase_local;
  TestCaseWrapper *this_local;
  
  tcu::TestContext::getLog(this->m_testCtx);
  (*(testCase->super_TestNode)._vptr_TestNode[3])();
  renderCtx = deqp::Context::getRenderContext(this->m_context);
  ctxInfo = deqp::Context::getContextInfo(this->m_context);
  glu::resetState(renderCtx,ctxInfo);
  return true;
}

Assistant:

bool TestCaseWrapper::deinitTestCase(tcu::TestCase* testCase)
{
	TestLog& log = m_testCtx.getLog();

	try
	{
		testCase->deinit();
	}
	catch (const tcu::Exception& e)
	{
		log << e;
		log << TestLog::Message << "Error in test case deinit, test program will terminate." << TestLog::EndMessage;
		return false;
	}

	try
	{
		// Clear state to defaults
		glu::resetState(m_context.getRenderContext(), m_context.getContextInfo());
	}
	catch (const std::exception& e)
	{
		log << e;
		log << TestLog::Message << "Error in state reset, test program will terminate." << TestLog::EndMessage;
		return false;
	}

	return true;
}